

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationengine.cpp
# Opt level: O2

void __thiscall CalculationEngine::CalculationEngine(CalculationEngine *this,ostream *os)

{
  unordered_map<ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>_>_>
  *puVar1;
  FloatType *this_00;
  IntegerType *this_01;
  ComplexType *this_02;
  undefined4 local_24;
  FloatType *local_20;
  
  local_24 = 1;
  this->mEvalMode = FLOAT;
  puVar1 = &this->mNumberTypes;
  (this->mNumberTypes)._M_h._M_buckets = &(this->mNumberTypes)._M_h._M_single_bucket;
  (this->mNumberTypes)._M_h._M_bucket_count = 1;
  (this->mNumberTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mNumberTypes)._M_h._M_element_count = 0;
  (this->mNumberTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mNumberTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mNumberTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (FloatType *)operator_new(0xe8);
  FloatType::FloatType(this_00);
  local_20 = this_00;
  std::
  _Hashtable<ResultValueType,std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<ResultValueType,std::unique_ptr<FloatType,std::default_delete<FloatType>>>
            ((_Hashtable<ResultValueType,std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,&local_24);
  if (local_20 != (FloatType *)0x0) {
    (*(local_20->super_NumberType)._vptr_NumberType[1])();
  }
  local_24 = 2;
  this_01 = (IntegerType *)operator_new(0xe8);
  IntegerType::IntegerType(this_01,os);
  local_20 = (FloatType *)this_01;
  std::
  _Hashtable<ResultValueType,std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<ResultValueType,std::unique_ptr<IntegerType,std::default_delete<IntegerType>>>
            ((_Hashtable<ResultValueType,std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,&local_24);
  if (local_20 != (FloatType *)0x0) {
    (*(local_20->super_NumberType)._vptr_NumberType[1])();
  }
  local_24 = 3;
  this_02 = (ComplexType *)operator_new(0xe8);
  ComplexType::ComplexType(this_02,os);
  local_20 = (FloatType *)this_02;
  std::
  _Hashtable<ResultValueType,std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<ResultValueType,std::unique_ptr<ComplexType,std::default_delete<ComplexType>>>
            ((_Hashtable<ResultValueType,std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>,std::__detail::_Select1st,std::equal_to<ResultValueType>,std::hash<ResultValueType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,&local_24);
  if (local_20 != (FloatType *)0x0) {
    (*(local_20->super_NumberType)._vptr_NumberType[1])();
  }
  return;
}

Assistant:

CalculationEngine::CalculationEngine(std::ostream& os)
	: mEvalMode(ResultValueType::FLOAT) {
	mNumberTypes.emplace(ResultValueType::FLOAT, std::unique_ptr<FloatType>(new FloatType));
	mNumberTypes.emplace(ResultValueType::INTEGER, std::unique_ptr<IntegerType>(new IntegerType(os)));
	mNumberTypes.emplace(ResultValueType::COMPLEX, std::unique_ptr<ComplexType>(new ComplexType(os)));
}